

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
AActor::LinkToWorld(AActor *this,FLinkContext *ctx,bool spawningmapthing,sector_t *sector)

{
  double dVar1;
  AActor *pAVar2;
  FBlockNode *pFVar3;
  int iVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  subsector_t *psVar8;
  msecnode_t *pmVar9;
  FBlockNode *pFVar10;
  uint uVar11;
  uint uVar12;
  undefined7 in_register_00000011;
  long lVar13;
  uint uVar14;
  long lVar15;
  WORD *pWVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  FBlockNode **ppFVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  FBlockNode **ppFVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  FPortalGroupArray check;
  FPortalGroupArray local_c8;
  ulong local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  long local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  DVector3 local_48;
  
  if ((((int)CONCAT71(in_register_00000011,spawningmapthing) == 0) || (sector != (sector_t *)0x0))
     || (((this->flags4).Value & 0x40) == 0)) {
    cVar6 = spawningmapthing;
    if (sector != (sector_t *)0x0) goto LAB_0041a0ed;
  }
  else {
    bVar5 = FixMapthingPos(this);
    cVar6 = !bVar5;
  }
  dVar29 = (this->__Pos).X;
  dVar30 = (this->__Pos).Y;
  if ((cVar6 == '\0') || (numgamenodes == 0)) {
    psVar8 = P_PointInSubsector(dVar29,dVar30);
    sector = (sector_t *)psVar8->sector;
  }
  else {
    sector = P_PointInSectorBuggy(dVar29,dVar30);
  }
LAB_0041a0ed:
  this->Sector = sector;
  psVar8 = R_PointInSubsector(SUB84((this->__Pos).X + 103079215104.0,0),
                              SUB84((this->__Pos).Y + 103079215104.0,0));
  this->subsector = psVar8;
  if (((this->flags).Value & 8) == 0) {
    pAVar2 = ((sector_t_conflict *)sector)->thinglist;
    this->snext = pAVar2;
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->sprev = &this->snext;
    }
    this->sprev = &((sector_t_conflict *)sector)->thinglist;
    ((sector_t_conflict *)sector)->thinglist = this;
    if (ctx == (FLinkContext *)0x0) {
      pmVar9 = (msecnode_t *)0x0;
    }
    else {
      pmVar9 = ctx->sector_list;
    }
    pmVar9 = P_CreateSecNodeList(this,this->radius,pmVar9,0x1c0);
    this->touching_sectorlist = pmVar9;
    dVar29 = this->renderradius;
    if (0.0 <= dVar29) {
      dVar30 = this->radius;
      uVar27 = SUB84(dVar30,0);
      uVar28 = (undefined4)((ulong)dVar30 >> 0x20);
      if (dVar30 <= dVar29) {
        uVar27 = SUB84(dVar29,0);
        uVar28 = (undefined4)((ulong)dVar29 >> 0x20);
      }
      if (ctx == (FLinkContext *)0x0) {
        pmVar9 = (msecnode_t *)0x0;
      }
      else {
        pmVar9 = ctx->render_list;
      }
      pmVar9 = P_CreateSecNodeList(this,(double)CONCAT44(uVar28,uVar27),pmVar9,0x1d0);
      this->touching_rendersectors = pmVar9;
    }
    else {
      this->touching_rendersectors = (msecnode_t *)0x0;
      if (ctx != (FLinkContext *)0x0) {
        P_DelSeclist(ctx->render_list,0x1d0);
      }
    }
  }
  if (((this->flags).Value & 0x10) == 0) {
    local_c8.data.Array = (unsigned_short *)0x0;
    local_c8.data.Most = 0;
    local_c8.data.Count = 0;
    local_c8.method = 1;
    local_c8.varused = 0;
    local_c8.inited = false;
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    local_48.Z = (this->__Pos).Z;
    P_CollectConnectedGroups
              (this->Sector->PortalGroup,&local_48,local_48.Z + this->Height,this->radius,&local_c8)
    ;
    this->BlockNode = (FBlockNode *)0x0;
    iVar4 = bmapwidth;
    uVar7 = (uint)local_c8.varused;
    if (-1 < (int)(local_c8.data.Count + local_c8.varused)) {
      ppFVar20 = &this->BlockNode;
      local_88 = bmaporgx;
      local_90 = bmaporgy;
      lVar15 = (long)bmapwidth;
      uVar17 = (ulong)(uint)bmapheight;
      uVar12 = bmapwidth - 1;
      iVar18 = bmapheight + -1;
      local_80 = lVar15 * 8;
      uVar19 = 0xffffffff;
      local_a0 = uVar17;
      uVar11 = local_c8.data.Count;
      do {
        uVar14 = (uint)uVar19;
        if (uVar14 == 0xffffffff) {
          dVar29 = (this->__Pos).X;
          dVar30 = (this->__Pos).Y;
        }
        else {
          pWVar16 = local_c8.entry + uVar19;
          if (3 < uVar14) {
            pWVar16 = local_c8.data.Array + (uVar14 - 4);
          }
          uVar14 = this->Sector->PortalGroup;
          dVar29 = 0.0;
          dVar30 = 0.0;
          if (uVar14 != (*pWVar16 & 0x3fff)) {
            dVar29 = Displacements.data.Array
                     [(int)((*pWVar16 & 0x3fff) * Displacements.size + uVar14)].pos.X;
            dVar30 = Displacements.data.Array
                     [(int)((*pWVar16 & 0x3fff) * Displacements.size + uVar14)].pos.Y;
          }
          dVar29 = (this->__Pos).X + dVar29;
          dVar30 = (this->__Pos).Y + dVar30;
        }
        dVar1 = this->radius;
        uVar14 = (uint)(((dVar29 - dVar1) - local_88) * 0.0078125);
        if (((int)uVar14 < iVar4) &&
           (uVar24 = (uint)(((dVar29 + dVar1) - local_88) * 0.0078125), -1 < (int)uVar24)) {
          iVar25 = (int)(((dVar30 + dVar1) - local_90) * 0.0078125);
          if (-1 < iVar25) {
            uVar21 = (uint)(((dVar30 - dVar1) - local_90) * 0.0078125);
            if ((int)uVar21 < (int)uVar17) {
              if ((int)uVar21 < 1) {
                uVar21 = 0;
              }
              if (iVar18 < iVar25) {
                iVar25 = iVar18;
              }
              if ((int)uVar21 <= iVar25) {
                local_98 = uVar19;
                if ((int)uVar12 < (int)uVar24) {
                  uVar24 = uVar12;
                }
                local_60 = (ulong)uVar14;
                if ((int)uVar14 < 1) {
                  local_60 = 0;
                }
                local_68 = (ulong)uVar24;
                uVar17 = (ulong)uVar21;
                iVar22 = uVar21 * iVar4 + (int)local_60;
                lVar23 = (lVar15 * uVar17 + local_60) * 8;
                local_70 = (uVar24 + 1) - local_60;
                local_78 = (ulong)(iVar25 + 1);
                do {
                  local_50 = uVar17;
                  local_58 = lVar23;
                  lVar13 = local_70;
                  iVar25 = iVar22;
                  if ((int)local_60 <= (int)local_68) {
                    do {
                      ppFVar26 = (FBlockNode **)((long)blocklinks + lVar23);
                      if (FBlockNode::FreeBlocks == (FBlockNode *)0x0) {
                        pFVar10 = (FBlockNode *)operator_new(0x30);
                      }
                      else {
                        pFVar10 = FBlockNode::FreeBlocks;
                        FBlockNode::FreeBlocks = FBlockNode::FreeBlocks->NextBlock;
                      }
                      pFVar10->BlockIndex = iVar25;
                      pFVar10->Me = this;
                      pFVar10->PrevActor = (FBlockNode **)0x0;
                      pFVar10->NextActor = (FBlockNode *)0x0;
                      pFVar10->PrevBlock = (FBlockNode **)0x0;
                      pFVar10->NextBlock = (FBlockNode *)0x0;
                      pFVar3 = *ppFVar26;
                      pFVar10->NextActor = pFVar3;
                      if (pFVar3 != (FBlockNode *)0x0) {
                        pFVar3->PrevActor = &pFVar10->NextActor;
                      }
                      pFVar10->PrevActor = ppFVar26;
                      *ppFVar26 = pFVar10;
                      pFVar10->PrevBlock = ppFVar20;
                      pFVar10->NextBlock = (FBlockNode *)0x0;
                      *ppFVar20 = pFVar10;
                      ppFVar20 = &pFVar10->NextBlock;
                      iVar25 = iVar25 + 1;
                      lVar23 = lVar23 + 8;
                      lVar13 = lVar13 + -1;
                    } while (lVar13 != 0);
                  }
                  uVar17 = local_50 + 1;
                  iVar22 = iVar22 + iVar4;
                  lVar23 = local_58 + local_80;
                } while (uVar17 != local_78);
                uVar7 = (uint)local_c8.varused;
                uVar17 = local_a0;
                uVar19 = local_98;
                uVar11 = local_c8.data.Count;
              }
            }
          }
        }
        uVar14 = (int)uVar19 + 1;
        uVar19 = (ulong)uVar14;
      } while ((int)uVar14 < (int)(uVar7 + uVar11));
    }
    TArray<unsigned_short,_unsigned_short>::~TArray(&local_c8.data);
  }
  if (!spawningmapthing) {
    UpdateRenderSectorList(this);
  }
  return;
}

Assistant:

void AActor::LinkToWorld(FLinkContext *ctx, bool spawningmapthing, sector_t *sector)
{
	bool spawning = spawningmapthing;

	if (spawning)
	{
		if ((flags4 & MF4_FIXMAPTHINGPOS) && sector == NULL)
		{
			if (FixMapthingPos()) spawning = false;
		}
	}

	if (sector == NULL)
	{
		if (!spawning || numgamenodes == 0)
		{
			sector = P_PointInSector(Pos());
		}
		else
		{
			sector = P_PointInSectorBuggy(X(), Y());
		}
	}

	Sector = sector;
	subsector = R_PointInSubsector(Pos());	// this is from the rendering nodes, not the gameplay nodes!

	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't go into the sector links
		// killough 8/11/98: simpler scheme using pointer-to-pointer prev
		// pointers, allows head nodes to be treated like everything else

		AActor **link = &sector->thinglist;
		AActor *next = *link;
		if ((snext = next))
			next->sprev = &snext;
		sprev = link;
		*link = this;

		// phares 3/16/98
		//
		// If sector_list isn't NULL, it has a collection of sector
		// nodes that were just removed from this Thing.

		// Collect the sectors the object will live in by looking at
		// the existing sector_list and adding new nodes and deleting
		// obsolete ones.

		// When a node is deleted, its sector links (the links starting
		// at sector_t->touching_thinglist) are broken. When a node is
		// added, new sector links are created.
		touching_sectorlist = P_CreateSecNodeList(this, radius, ctx != nullptr? ctx->sector_list : nullptr, &sector_t::touching_thinglist);	// Attach to thing
		if (renderradius >= 0) touching_rendersectors = P_CreateSecNodeList(this, MAX(radius, renderradius), ctx != nullptr ? ctx->render_list : nullptr, &sector_t::touching_renderthings);
		else
		{
			touching_rendersectors = nullptr;
			if (ctx != nullptr) P_DelSeclist(ctx->render_list, &sector_t::touching_renderthings);
		}
	}


	// link into blockmap (inert things don't need to be in the blockmap)
	if (!(flags & MF_NOBLOCKMAP))
	{
		FPortalGroupArray check;

		P_CollectConnectedGroups(Sector->PortalGroup, Pos(), Top(), radius, check);

		BlockNode = NULL;
		FBlockNode **alink = &this->BlockNode;
		for (int i = -1; i < (int)check.Size(); i++)
		{
			DVector3 pos = i==-1? Pos() : PosRelative(check[i] & ~FPortalGroupArray::FLAT);

			int x1 = GetBlockX(pos.X - radius);
			int x2 = GetBlockX(pos.X + radius);
			int y1 = GetBlockY(pos.Y - radius);
			int y2 = GetBlockY(pos.Y + radius);

			if (x1 >= bmapwidth || x2 < 0 || y1 >= bmapheight || y2 < 0)
			{ // thing is off the map
			}
			else
			{ // [RH] Link into every block this actor touches, not just the center one
				x1 = MAX(0, x1);
				y1 = MAX(0, y1);
				x2 = MIN(bmapwidth - 1, x2);
				y2 = MIN(bmapheight - 1, y2);
				for (int y = y1; y <= y2; ++y)
				{
					for (int x = x1; x <= x2; ++x)
					{
						FBlockNode **link = &blocklinks[y*bmapwidth + x];
						FBlockNode *node = FBlockNode::Create(this, x, y, this->Sector->PortalGroup);

						// Link in to block
						if ((node->NextActor = *link) != NULL)
						{
							(*link)->PrevActor = &node->NextActor;
						}
						node->PrevActor = link;
						*link = node;

						// Link in to actor
						node->PrevBlock = alink;
						node->NextBlock = NULL;
						(*alink) = node;
						alink = &node->NextBlock;
					}
				}
			}
		}
	}
	// Portal links cannot be done unless the level is fully initialized.
	if (!spawningmapthing) UpdateRenderSectorList();
}